

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directed_flag_complex_computer.h
# Opt level: O0

void directed_flag_complex_computer::prepare_graph_filtration<directed_flag_complex_t>
               (directed_flag_complex_t *complex,filtered_directed_graph_t *graph,
               filtration_algorithm_t *filtration_algorithm,size_t nb_threads)

{
  bool bVar1;
  size_type sVar2;
  ulong uVar3;
  ostream *poVar4;
  reference _new_edges;
  reference _new_filtration;
  reference pfVar5;
  reference pvVar6;
  reference puVar7;
  reference pvVar8;
  hash_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t> *in_RCX;
  long *in_RDX;
  ushort *in_RSI;
  value_type vVar9;
  __enable_if_t<is_constructible<value_type,_pair<directed_flag_complex_cell_t,_unsigned_long>_&&>::value,_pair<iterator,_bool>_>
  _Var10;
  unsigned_short e_1;
  iterator __end3;
  iterator __begin3;
  value_type *__range3;
  float f_1;
  iterator __end4_1;
  iterator __begin4_1;
  value_type *__range4_1;
  size_t i_3;
  size_t current_edge_index;
  size_t current_filtration_index;
  hash_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t> empty;
  size_t i_2;
  vector<directed_flag_complex_computer::reorder_edges_t,_std::allocator<directed_flag_complex_computer::reorder_edges_t>_>
  reorder_filtration;
  size_t i_1;
  directed_flag_complex_cell_t c;
  vertex_index_t *e;
  hash_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t> hash;
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  new_filtrations;
  vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
  new_edges;
  float f;
  iterator __end4;
  iterator __begin4;
  vector<float,_std::allocator<float>_> *__range4;
  size_t i;
  vector<directed_flag_complex_computer::compute_filtration_t,_std::allocator<directed_flag_complex_computer::compute_filtration_t>_>
  compute_filtration;
  vector<hash_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t>,_std::allocator<hash_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t>_>_>
  tmp;
  bool computed_edge_filtration;
  vertex_index_t v;
  directed_flag_complex_cell_t cell;
  compute_filtration_t *in_stack_fffffffffffffc78;
  undefined2 in_stack_fffffffffffffc80;
  unsigned_short in_stack_fffffffffffffc82;
  float in_stack_fffffffffffffc84;
  pair<directed_flag_complex_cell_t,_unsigned_long> *in_stack_fffffffffffffc88;
  vector<float,_std::allocator<float>_> *_old_filtration;
  undefined7 in_stack_fffffffffffffc90;
  byte in_stack_fffffffffffffc97;
  filtration_algorithm_t *in_stack_fffffffffffffc98;
  undefined6 in_stack_fffffffffffffca0;
  undefined1 in_stack_fffffffffffffca6;
  undefined1 in_stack_fffffffffffffca7;
  size_type in_stack_fffffffffffffca8;
  vector<float,_std::allocator<float>_> *in_stack_fffffffffffffcb0;
  hash_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t>
  *in_stack_fffffffffffffcb8;
  hash_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t> *__a;
  undefined1 *in_stack_fffffffffffffd10;
  undefined6 in_stack_fffffffffffffd18;
  undefined2 in_stack_fffffffffffffd1e;
  directed_flag_complex_t *in_stack_fffffffffffffd20;
  __normal_iterator<unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
  local_2d8;
  reference local_2d0;
  float local_2c4;
  float *local_2c0;
  __normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_> local_2b8;
  reference local_2b0;
  hash_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t> *local_2a8;
  size_type local_2a0;
  size_type local_298;
  reorder_edges_t local_250;
  hash_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t> *local_228;
  _Node_iterator_base<std::pair<const_directed_flag_complex_cell_t,_unsigned_long>,_true> local_208;
  undefined1 local_200;
  hash_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t> *local_1e0;
  directed_flag_complex_cell_t local_1d8;
  reference local_1c8;
  hash_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t> local_1c0;
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  local_178;
  vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
  local_158;
  float local_13c;
  float *local_138;
  __normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_> local_130;
  undefined1 local_128 [24];
  undefined1 *local_110;
  hash_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t> *local_108;
  vector<directed_flag_complex_computer::compute_filtration_t,_std::allocator<directed_flag_complex_computer::compute_filtration_t>_>
  local_a0 [2];
  byte local_63;
  vertex_index_t local_62;
  directed_flag_complex_cell_t local_60 [2];
  undefined1 local_3d;
  undefined4 local_3c;
  hash_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t> *local_20;
  long *local_18;
  ushort *local_10;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  if (in_RDX == (long *)0x0) {
    std::vector<float,_std::allocator<float>_>::size
              ((vector<float,_std::allocator<float>_> *)(in_RSI + 0x54));
    local_3c = 0;
    in_stack_fffffffffffffd10 = &local_3d;
    std::allocator<float>::allocator((allocator<float> *)0x1e7b12);
    std::vector<float,_std::allocator<float>_>::vector
              ((vector<float,_std::allocator<float>_> *)
               CONCAT17(in_stack_fffffffffffffca7,
                        CONCAT16(in_stack_fffffffffffffca6,in_stack_fffffffffffffca0)),
               (size_type)in_stack_fffffffffffffc98,
               (value_type_conflict2 *)CONCAT17(in_stack_fffffffffffffc97,in_stack_fffffffffffffc90)
               ,(allocator_type *)in_stack_fffffffffffffc88);
    std::vector<float,_std::allocator<float>_>::operator=
              ((vector<float,_std::allocator<float>_> *)
               CONCAT17(in_stack_fffffffffffffc97,in_stack_fffffffffffffc90),
               (vector<float,_std::allocator<float>_> *)in_stack_fffffffffffffc88);
    std::vector<float,_std::allocator<float>_>::~vector
              ((vector<float,_std::allocator<float>_> *)
               CONCAT17(in_stack_fffffffffffffc97,in_stack_fffffffffffffc90));
    std::allocator<float>::~allocator((allocator<float> *)0x1e7b6f);
  }
  else {
    uVar3 = (**(code **)(*in_RDX + 0x18))();
    if ((uVar3 & 1) != 0) {
      directed_flag_complex_cell_t::directed_flag_complex_cell_t(local_60);
      for (local_62 = 0; local_62 < *local_10; local_62 = local_62 + 1) {
        directed_flag_complex_cell_t::set_vertices(local_60,&local_62);
        vVar9 = (value_type)(**(code **)(*local_18 + 0x10))(local_18,0,local_60,local_10,0);
        pvVar6 = std::vector<float,_std::allocator<float>_>::operator[]
                           ((vector<float,_std::allocator<float>_> *)(local_10 + 0x54),
                            (ulong)local_62);
        *pvVar6 = vVar9;
      }
    }
  }
  local_63 = 0;
  if ((local_18 != (long *)0x0) &&
     ((sVar2 = std::vector<float,_std::allocator<float>_>::size
                         ((vector<float,_std::allocator<float>_> *)(local_10 + 0x60)), sVar2 == 0 ||
      (uVar3 = (**(code **)(*local_18 + 0x20))(), (uVar3 & 1) != 0)))) {
    local_63 = 1;
    poVar4 = std::operator<<((ostream *)&std::cout,"\x1b[K");
    poVar4 = std::operator<<(poVar4,"computing the filtration of all edges");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::flush<char,std::char_traits<char>>);
    std::operator<<(poVar4,"\r");
    std::
    allocator<hash_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t>_>
    ::allocator((allocator<hash_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t>_>
                 *)0x1e7d11);
    std::
    vector<hash_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t>,_std::allocator<hash_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t>_>_>
    ::vector((vector<hash_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t>,_std::allocator<hash_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t>_>_>
              *)CONCAT17(in_stack_fffffffffffffca7,
                         CONCAT16(in_stack_fffffffffffffca6,in_stack_fffffffffffffca0)),
             (size_type)in_stack_fffffffffffffc98,
             (allocator_type *)CONCAT17(in_stack_fffffffffffffc97,in_stack_fffffffffffffc90));
    std::
    allocator<hash_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t>_>
    ::~allocator((allocator<hash_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t>_>
                  *)0x1e7d39);
    in_stack_fffffffffffffc78 = (compute_filtration_t *)0x0;
    compute_filtration_t::compute_filtration_t
              ((compute_filtration_t *)
               CONCAT17(in_stack_fffffffffffffca7,
                        CONCAT16(in_stack_fffffffffffffca6,in_stack_fffffffffffffca0)),
               in_stack_fffffffffffffc98,
               (filtered_directed_graph_t *)
               CONCAT17(in_stack_fffffffffffffc97,in_stack_fffffffffffffc90),
               (vector<float,_std::allocator<float>_> *)in_stack_fffffffffffffc88,
               (vector<hash_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t>,_std::allocator<hash_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t>_>_>
                *)CONCAT44(in_stack_fffffffffffffc84,
                           CONCAT22(in_stack_fffffffffffffc82,in_stack_fffffffffffffc80)),0,
               (size_t *)in_stack_fffffffffffffcb0);
    std::allocator<directed_flag_complex_computer::compute_filtration_t>::allocator
              ((allocator<directed_flag_complex_computer::compute_filtration_t> *)0x1e7d93);
    std::
    vector<directed_flag_complex_computer::compute_filtration_t,_std::allocator<directed_flag_complex_computer::compute_filtration_t>_>
    ::vector((vector<directed_flag_complex_computer::compute_filtration_t,_std::allocator<directed_flag_complex_computer::compute_filtration_t>_>
              *)CONCAT17(in_stack_fffffffffffffca7,
                         CONCAT16(in_stack_fffffffffffffca6,in_stack_fffffffffffffca0)),
             (size_type)in_stack_fffffffffffffc98,
             (value_type *)CONCAT17(in_stack_fffffffffffffc97,in_stack_fffffffffffffc90),
             (allocator_type *)in_stack_fffffffffffffc88);
    std::allocator<directed_flag_complex_computer::compute_filtration_t>::~allocator
              ((allocator<directed_flag_complex_computer::compute_filtration_t> *)0x1e7dc1);
    compute_filtration_t::~compute_filtration_t((compute_filtration_t *)0x1e7dce);
    directed_flag_complex_t::for_each_cell<directed_flag_complex_computer::compute_filtration_t>
              (in_stack_fffffffffffffd20,
               (vector<directed_flag_complex_computer::compute_filtration_t,_std::allocator<directed_flag_complex_computer::compute_filtration_t>_>
                *)CONCAT26(in_stack_fffffffffffffd1e,in_stack_fffffffffffffd18),
               (int)((ulong)in_stack_fffffffffffffd10 >> 0x20),(int)in_stack_fffffffffffffd10);
    std::vector<float,_std::allocator<float>_>::clear
              ((vector<float,_std::allocator<float>_> *)0x1e7e03);
    directed_graph_t::edge_number((directed_graph_t *)0x1e7e1e);
    std::vector<float,_std::allocator<float>_>::reserve
              (in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8);
    for (local_108 = (hash_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t>
                      *)0x0; local_108 < local_20;
        local_108 = (hash_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t>
                     *)&(local_108->
                        super_unordered_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t,_std::allocator<std::pair<const_directed_flag_complex_cell_t,_unsigned_long>_>_>
                        )._M_h.field_0x1) {
      std::
      vector<directed_flag_complex_computer::compute_filtration_t,_std::allocator<directed_flag_complex_computer::compute_filtration_t>_>
      ::operator[](local_a0,(size_type)local_108);
      compute_filtration_t::filtration(in_stack_fffffffffffffc78);
      local_110 = local_128;
      local_130._M_current =
           (float *)std::vector<float,_std::allocator<float>_>::begin
                              ((vector<float,_std::allocator<float>_> *)in_stack_fffffffffffffc78);
      local_138 = (float *)std::vector<float,_std::allocator<float>_>::end
                                     ((vector<float,_std::allocator<float>_> *)
                                      in_stack_fffffffffffffc78);
      while (bVar1 = __gnu_cxx::operator!=
                               ((__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>
                                 *)CONCAT44(in_stack_fffffffffffffc84,
                                            CONCAT22(in_stack_fffffffffffffc82,
                                                     in_stack_fffffffffffffc80)),
                                (__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>
                                 *)in_stack_fffffffffffffc78), bVar1) {
        pfVar5 = __gnu_cxx::__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>
                 ::operator*(&local_130);
        local_13c = *pfVar5;
        std::vector<float,_std::allocator<float>_>::push_back
                  ((vector<float,_std::allocator<float>_> *)
                   CONCAT17(in_stack_fffffffffffffc97,in_stack_fffffffffffffc90),
                   (value_type_conflict2 *)in_stack_fffffffffffffc88);
        __gnu_cxx::__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>::
        operator++(&local_130);
      }
      std::vector<float,_std::allocator<float>_>::~vector
                ((vector<float,_std::allocator<float>_> *)
                 CONCAT17(in_stack_fffffffffffffc97,in_stack_fffffffffffffc90));
    }
    std::
    vector<directed_flag_complex_computer::compute_filtration_t,_std::allocator<directed_flag_complex_computer::compute_filtration_t>_>
    ::~vector((vector<directed_flag_complex_computer::compute_filtration_t,_std::allocator<directed_flag_complex_computer::compute_filtration_t>_>
               *)CONCAT17(in_stack_fffffffffffffc97,in_stack_fffffffffffffc90));
    std::
    vector<hash_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t>,_std::allocator<hash_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t>_>_>
    ::~vector((vector<hash_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t>,_std::allocator<hash_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t>_>_>
               *)CONCAT17(in_stack_fffffffffffffc97,in_stack_fffffffffffffc90));
  }
  std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>::allocator
            ((allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_> *)0x1e804e);
  std::
  vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
  ::vector((vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
            *)CONCAT17(in_stack_fffffffffffffca7,
                       CONCAT16(in_stack_fffffffffffffca6,in_stack_fffffffffffffca0)),
           (size_type)in_stack_fffffffffffffc98,
           (allocator_type *)CONCAT17(in_stack_fffffffffffffc97,in_stack_fffffffffffffc90));
  std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>::~allocator
            ((allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_> *)0x1e8074);
  __a = local_20;
  std::allocator<std::vector<float,_std::allocator<float>_>_>::allocator
            ((allocator<std::vector<float,_std::allocator<float>_>_> *)0x1e8093);
  std::
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ::vector((vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
            *)CONCAT17(in_stack_fffffffffffffca7,
                       CONCAT16(in_stack_fffffffffffffca6,in_stack_fffffffffffffca0)),
           (size_type)in_stack_fffffffffffffc98,
           (allocator_type *)CONCAT17(in_stack_fffffffffffffc97,in_stack_fffffffffffffc90));
  std::allocator<std::vector<float,_std::allocator<float>_>_>::~allocator
            ((allocator<std::vector<float,_std::allocator<float>_>_> *)0x1e80b9);
  hash_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t>::hash_map
            ((hash_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t>
              *)0x1e80c6);
  if (local_18 != (long *)0x0) {
    cell_hasher_t::set_current_cell_dimension(1);
    local_1c8 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                          ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)(local_10 + 4)
                           ,0);
    directed_flag_complex_cell_t::directed_flag_complex_cell_t(&local_1d8);
    local_1e0 = (hash_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t>
                 *)0x0;
    while (in_stack_fffffffffffffcb8 = local_1e0,
          sVar2 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::size
                            ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
                             (local_10 + 4)),
          in_stack_fffffffffffffcb8 <
          (hash_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t> *)
          (sVar2 >> 1)) {
      directed_flag_complex_cell_t::set_vertices(&local_1d8,local_1c8);
      std::make_pair<directed_flag_complex_cell_t&,unsigned_long&>
                (&in_stack_fffffffffffffc88->first,
                 (unsigned_long *)
                 CONCAT44(in_stack_fffffffffffffc84,
                          CONCAT22(in_stack_fffffffffffffc82,in_stack_fffffffffffffc80)));
      _Var10 = std::
               unordered_map<directed_flag_complex_cell_t,unsigned_long,cell_hasher_t,cell_comparer_t,std::allocator<std::pair<directed_flag_complex_cell_t_const,unsigned_long>>>
               ::insert<std::pair<directed_flag_complex_cell_t,unsigned_long>>
                         ((unordered_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t,_std::allocator<std::pair<const_directed_flag_complex_cell_t,_unsigned_long>_>_>
                           *)CONCAT17(in_stack_fffffffffffffc97,in_stack_fffffffffffffc90),
                          in_stack_fffffffffffffc88);
      local_208._M_cur =
           (__node_type *)
           _Var10.first.
           super__Node_iterator_base<std::pair<const_directed_flag_complex_cell_t,_unsigned_long>,_true>
           ._M_cur;
      local_200 = _Var10.second;
      local_1e0 = (hash_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t>
                   *)&(local_1e0->
                      super_unordered_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t,_std::allocator<std::pair<const_directed_flag_complex_cell_t,_unsigned_long>_>_>
                      )._M_h.field_0x1;
      local_1c8 = local_1c8 + 2;
    }
  }
  std::
  vector<directed_flag_complex_computer::reorder_edges_t,_std::allocator<directed_flag_complex_computer::reorder_edges_t>_>
  ::vector((vector<directed_flag_complex_computer::reorder_edges_t,_std::allocator<directed_flag_complex_computer::reorder_edges_t>_>
            *)0x1e8258);
  for (local_228 = (hash_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t>
                    *)0x0; local_228 < local_20;
      local_228 = (hash_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t>
                   *)&(local_228->
                      super_unordered_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t,_std::allocator<std::pair<const_directed_flag_complex_cell_t,_unsigned_long>_>_>
                      )._M_h.field_0x1) {
    _new_edges = std::
                 vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
                 ::operator[](&local_158,(size_type)local_228);
    in_stack_fffffffffffffc97 = (local_63 & 1) == 0 && local_18 != (long *)0x0;
    _old_filtration = (vector<float,_std::allocator<float>_> *)(local_10 + 0x60);
    _new_filtration =
         std::
         vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
         ::operator[](&local_178,(size_type)local_228);
    reorder_edges_t::reorder_edges_t
              (&local_250,_new_edges,(bool)(in_stack_fffffffffffffc97 & 1),&local_1c0,
               _old_filtration,_new_filtration);
    std::
    vector<directed_flag_complex_computer::reorder_edges_t,_std::allocator<directed_flag_complex_computer::reorder_edges_t>_>
    ::push_back((vector<directed_flag_complex_computer::reorder_edges_t,_std::allocator<directed_flag_complex_computer::reorder_edges_t>_>
                 *)CONCAT44(in_stack_fffffffffffffc84,
                            CONCAT22(in_stack_fffffffffffffc82,in_stack_fffffffffffffc80)),
                (value_type *)in_stack_fffffffffffffc78);
  }
  directed_flag_complex_t::for_each_cell<directed_flag_complex_computer::reorder_edges_t>
            (in_stack_fffffffffffffd20,
             (vector<directed_flag_complex_computer::reorder_edges_t,_std::allocator<directed_flag_complex_computer::reorder_edges_t>_>
              *)CONCAT26(in_stack_fffffffffffffd1e,in_stack_fffffffffffffd18),
             (int)((ulong)in_stack_fffffffffffffd10 >> 0x20),(int)in_stack_fffffffffffffd10);
  std::
  unordered_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t,_std::allocator<std::pair<const_directed_flag_complex_cell_t,_unsigned_long>_>_>
  ::clear((unordered_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t,_std::allocator<std::pair<const_directed_flag_complex_cell_t,_unsigned_long>_>_>
           *)0x1e8398);
  hash_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t>::hash_map
            ((hash_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t>
              *)0x1e83a5);
  std::swap<hash_map<directed_flag_complex_cell_t,unsigned_long,cell_hasher_t,cell_comparer_t>>
            (__a,in_stack_fffffffffffffcb8);
  local_298 = 0;
  local_2a0 = 0;
  for (local_2a8 = (hash_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t>
                    *)0x0; local_2a8 < local_20;
      local_2a8 = (hash_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t>
                   *)&(local_2a8->
                      super_unordered_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t,_std::allocator<std::pair<const_directed_flag_complex_cell_t,_unsigned_long>_>_>
                      )._M_h.field_0x1) {
    if ((local_63 & 1) == 0) {
      local_2b0 = std::
                  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                  ::operator[](&local_178,(size_type)local_2a8);
      local_2b8._M_current =
           (float *)std::vector<float,_std::allocator<float>_>::begin
                              ((vector<float,_std::allocator<float>_> *)in_stack_fffffffffffffc78);
      local_2c0 = (float *)std::vector<float,_std::allocator<float>_>::end
                                     ((vector<float,_std::allocator<float>_> *)
                                      in_stack_fffffffffffffc78);
      while (bVar1 = __gnu_cxx::operator!=
                               ((__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>
                                 *)CONCAT44(in_stack_fffffffffffffc84,
                                            CONCAT22(in_stack_fffffffffffffc82,
                                                     in_stack_fffffffffffffc80)),
                                (__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>
                                 *)in_stack_fffffffffffffc78), bVar1) {
        pfVar5 = __gnu_cxx::__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>
                 ::operator*(&local_2b8);
        sVar2 = local_298;
        in_stack_fffffffffffffc84 = *pfVar5;
        local_298 = local_298 + 1;
        local_2c4 = in_stack_fffffffffffffc84;
        pvVar6 = std::vector<float,_std::allocator<float>_>::operator[]
                           ((vector<float,_std::allocator<float>_> *)(local_10 + 0x60),sVar2);
        *pvVar6 = in_stack_fffffffffffffc84;
        __gnu_cxx::__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>::
        operator++(&local_2b8);
      }
    }
    local_2d0 = std::
                vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
                ::operator[](&local_158,(size_type)local_2a8);
    local_2d8._M_current =
         (unsigned_short *)
         std::vector<unsigned_short,_std::allocator<unsigned_short>_>::begin
                   ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
                    in_stack_fffffffffffffc78);
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::end
              ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)in_stack_fffffffffffffc78)
    ;
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
                               *)CONCAT44(in_stack_fffffffffffffc84,
                                          CONCAT22(in_stack_fffffffffffffc82,
                                                   in_stack_fffffffffffffc80)),
                              (__normal_iterator<unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
                               *)in_stack_fffffffffffffc78), bVar1) {
      puVar7 = __gnu_cxx::
               __normal_iterator<unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
               ::operator*(&local_2d8);
      sVar2 = local_2a0;
      in_stack_fffffffffffffc82 = *puVar7;
      local_2a0 = local_2a0 + 1;
      pvVar8 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                         ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)(local_10 + 4),
                          sVar2);
      *pvVar8 = in_stack_fffffffffffffc82;
      __gnu_cxx::
      __normal_iterator<unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
      ::operator++(&local_2d8);
    }
  }
  hash_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t>::~hash_map
            ((hash_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t>
              *)0x1e85c4);
  std::
  vector<directed_flag_complex_computer::reorder_edges_t,_std::allocator<directed_flag_complex_computer::reorder_edges_t>_>
  ::~vector((vector<directed_flag_complex_computer::reorder_edges_t,_std::allocator<directed_flag_complex_computer::reorder_edges_t>_>
             *)CONCAT17(in_stack_fffffffffffffc97,in_stack_fffffffffffffc90));
  hash_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t>::~hash_map
            ((hash_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t>
              *)0x1e85de);
  std::
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ::~vector((vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
             *)CONCAT17(in_stack_fffffffffffffc97,in_stack_fffffffffffffc90));
  std::
  vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
  ::~vector((vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
             *)CONCAT17(in_stack_fffffffffffffc97,in_stack_fffffffffffffc90));
  return;
}

Assistant:

void prepare_graph_filtration(Complex& complex, filtered_directed_graph_t& graph,
                              filtration_algorithm_t* filtration_algorithm, const size_t nb_threads) {
	if (filtration_algorithm == nullptr) {
		// All vertices get the trivial filtration value
		graph.vertex_filtration = std::vector<value_t>(graph.vertex_filtration.size(), 0);
	} else {
		if (filtration_algorithm->overwrite_vertex_filtration()) {
			directed_flag_complex_cell_t cell;
			for (vertex_index_t v = 0; v < graph.number_of_vertices; v++) {
				cell.set_vertices(&v);
				graph.vertex_filtration[v] = filtration_algorithm->compute_filtration(0, cell, graph, nullptr);
			}
		}
	}

	bool computed_edge_filtration = false;
	if (filtration_algorithm != nullptr &&
	    (graph.edge_filtration.size() == 0 || filtration_algorithm->overwrite_edge_filtration())) {
		computed_edge_filtration = true;
#ifdef INDICATE_PROGRESS
		std::cout << "\033[K"
		          << "computing the filtration of all edges" << std::flush << "\r";
#endif

		// Dummy parameter because we pass by reference the argument and
		// It cannot take a default value
		std::vector<cell_hash_map_t> tmp(0);
		std::vector<compute_filtration_t> compute_filtration(
		    nb_threads, compute_filtration_t(filtration_algorithm, graph, graph.vertex_filtration, tmp, nb_threads));
		complex.for_each_cell(compute_filtration, 1);
		graph.edge_filtration.clear();
		graph.edge_filtration.reserve(graph.edge_number());
		for (size_t i = 0; i < nb_threads; i++) {
			for (auto f : compute_filtration[i].filtration()) graph.edge_filtration.push_back(f);
		}
	}

	// Now, we reorder the edges and their filtration value such that it matches
	// the iteration order of "for_each_cell"
	std::vector<std::vector<vertex_index_t>> new_edges(nb_threads);
	std::vector<std::vector<value_t>> new_filtrations(nb_threads);

	hash_map<directed_flag_complex_cell_t, size_t, cell_hasher_t, cell_comparer_t> hash;
	if (filtration_algorithm != nullptr) {
		cell_hasher_t::set_current_cell_dimension(1);
		vertex_index_t* e = &(graph.edges[0]);
		directed_flag_complex_cell_t c;
		for (size_t i = 0; i < graph.edges.size() / 2; ++i, e += 2) {
			c.set_vertices(e);
			hash.insert(std::make_pair(c, i));
		}
	}

	std::vector<reorder_edges_t> reorder_filtration;
	for (size_t i = 0; i < nb_threads; i++) {
		reorder_filtration.push_back(reorder_edges_t(new_edges[i],
		                                             !computed_edge_filtration && filtration_algorithm != nullptr, hash,
		                                             graph.edge_filtration, new_filtrations[i]));
	}
	complex.for_each_cell(reorder_filtration, 1);

	hash.clear();
	hash_map<directed_flag_complex_cell_t, size_t, cell_hasher_t, cell_comparer_t> empty;
	std::swap(hash, empty);

	size_t current_filtration_index = 0;
	size_t current_edge_index = 0;
	for (size_t i = 0; i < nb_threads; i++) {
		if (!computed_edge_filtration)
			for (auto f : new_filtrations[i]) graph.edge_filtration[current_filtration_index++] = f;
		for (auto e : new_edges[i]) graph.edges[current_edge_index++] = e;
	}
}